

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetImportedXcFrameworkPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmValue *this_00;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  string *psVar4;
  allocator<char> local_f1;
  string local_f0;
  cmValue local_d0;
  cmValue location;
  cmValue configLocation;
  string impProp;
  string suffix;
  cmValue imp;
  cmValue loc;
  string result;
  undefined1 local_40 [8];
  string desiredConfig;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  desiredConfig.field_2._8_8_ = config;
  bVar1 = IsApple(this);
  if (((!bVar1) || (bVar1 = IsImported(this), !bVar1)) ||
     ((TVar2 = GetType(this), TVar2 != SHARED_LIBRARY &&
      ((TVar2 = GetType(this), TVar2 != STATIC_LIBRARY &&
       (TVar2 = GetType(this), TVar2 != UNKNOWN_LIBRARY)))))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)local_40,(string *)desiredConfig.field_2._8_8_);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_40,"NOCONFIG");
  }
  std::__cxx11::string::string((string *)&loc);
  cmValue::cmValue(&imp,(nullptr_t)0x0);
  this_00 = (cmValue *)((long)&suffix.field_2 + 8);
  cmValue::cmValue(this_00,(nullptr_t)0x0);
  std::__cxx11::string::string((string *)(impProp.field_2._M_local_buf + 8));
  bVar1 = cmTarget::GetMappedConfig
                    (this->Target,(string *)local_40,&imp,this_00,
                     (string *)(impProp.field_2._M_local_buf + 8));
  if (bVar1) {
    bVar1 = cmValue::operator_cast_to_bool(&imp);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&imp);
      std::__cxx11::string::operator=((string *)&loc,(string *)psVar4);
    }
    else {
      cmStrCat<char_const(&)[18],std::__cxx11::string&>
                ((string *)&configLocation,(char (*) [18])"IMPORTED_LOCATION",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&impProp.field_2 + 8));
      location = GetProperty(this,(string *)&configLocation);
      bVar1 = cmValue::operator_cast_to_bool(&location);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&location);
        std::__cxx11::string::operator=((string *)&loc,(string *)psVar4);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"IMPORTED_LOCATION",&local_f1);
        local_d0 = GetProperty(this,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        bVar1 = cmValue::operator_cast_to_bool(&local_d0);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_d0);
          std::__cxx11::string::operator=((string *)&loc,(string *)psVar4);
        }
      }
      std::__cxx11::string::~string((string *)&configLocation);
    }
    bVar1 = cmSystemTools::IsPathToXcFramework((string *)&loc);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&loc);
      goto LAB_00935608;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
LAB_00935608:
  std::__cxx11::string::~string((string *)(impProp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&loc);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetImportedXcFrameworkPath(
  const std::string& config) const
{
  if (!(this->IsApple() && this->IsImported() &&
        (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
         this->GetType() == cmStateEnums::STATIC_LIBRARY ||
         this->GetType() == cmStateEnums::UNKNOWN_LIBRARY))) {
    return {};
  }

  std::string desiredConfig = config;
  if (config.empty()) {
    desiredConfig = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->Target->GetMappedConfig(desiredConfig, loc, imp, suffix)) {
    if (loc) {
      result = *loc;
    } else {
      std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
      if (cmValue configLocation = this->GetProperty(impProp)) {
        result = *configLocation;
      } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
        result = *location;
      }
    }

    if (cmSystemTools::IsPathToXcFramework(result)) {
      return result;
    }
  }

  return {};
}